

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 *pUVar3;
  char cVar4;
  undefined8 uVar5;
  ZSTD_matchState_t *pZVar6;
  U32 lowestValid;
  byte bVar7;
  uint uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  BYTE *litEnd;
  int iVar15;
  uint uVar16;
  seqDef *psVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  BYTE *pBVar26;
  uint uVar27;
  ulong *puVar28;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_d8;
  uint local_d0;
  uint local_cc;
  ZSTD_matchState_t *local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  ulong *local_b0;
  seqStore_t *local_a8;
  BYTE *local_a0;
  ulong *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  ulong *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  ulong *local_50;
  uint *local_48;
  BYTE *local_40;
  ulong local_38;
  
  local_a0 = (ms->window).base;
  uVar16 = (ms->window).dictLimit;
  local_40 = local_a0 + uVar16;
  local_b8 = (ms->cParams).minMatch;
  if (5 < local_b8) {
    local_b8 = 6;
  }
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  local_b4 = (ms->cParams).searchLog;
  local_cc = 6;
  if (local_b4 < 6) {
    local_cc = local_b4;
  }
  if (local_cc < 5) {
    local_cc = 4;
  }
  puVar22 = (ulong *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar15 = (int)puVar22 - (int)local_a0;
  local_60 = *rep;
  local_5c = iVar15 - uVar21;
  if (iVar15 - uVar16 <= uVar21) {
    local_5c = uVar16;
  }
  uVar21 = 0;
  if (ms->loadedDictEnd != 0) {
    local_5c = uVar16;
  }
  local_64 = rep[1];
  local_5c = iVar15 - local_5c;
  uVar16 = local_64;
  if (local_5c < local_64) {
    uVar16 = uVar21;
  }
  uVar8 = local_60;
  if (local_5c < local_60) {
    uVar8 = uVar21;
  }
  uVar25 = (ulong)uVar8;
  ms->lazySkipping = 0;
  local_98 = (ulong *)((long)src + (srcSize - 0x10));
  uVar14 = ms->nextToUpdate;
  uVar18 = (ulong)uVar14;
  uVar12 = ((int)local_98 - (int)(local_a0 + uVar18)) + 1;
  uVar27 = 8;
  if (uVar12 < 8) {
    uVar27 = uVar12;
  }
  if (local_98 < local_a0 + uVar18) {
    uVar27 = uVar21;
  }
  bVar7 = (byte)local_cc;
  local_d0 = uVar16;
  local_c8 = ms;
  local_a8 = seqStore;
  local_70 = puVar22;
  local_48 = rep;
  if (uVar14 < uVar27 + uVar14) {
    local_b0 = (ulong *)srcSize;
    if (0x20 < ms->rowHashLog + 8) {
LAB_001dc770:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar26 = ms->tagTable;
    uVar20 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_b8 == 5) {
        uVar24 = *(long *)(local_a0 + uVar18) * -0x30e4432345000000;
LAB_001dbb0d:
        uVar21 = (uint)((uVar24 ^ uVar20) >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (local_b8 == 6) {
          uVar24 = *(long *)(local_a0 + uVar18) * -0x30e4432340650000;
          goto LAB_001dbb0d;
        }
        uVar21 = (*(int *)(local_a0 + uVar18) * -0x61c8864f ^ (uint)uVar20) >>
                 (0x18U - cVar4 & 0x1f);
      }
      uVar12 = (uVar21 >> 8) << (bVar7 & 0x1f);
      if (((ulong)(pUVar3 + uVar12) & 0x3f) != 0) {
LAB_001dc697:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar26 + uVar12) & ~(-1L << (bVar7 & 0x3f))) != 0) {
LAB_001dc678:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar18 & 7] = uVar21;
      uVar18 = uVar18 + 1;
    } while (uVar27 + uVar14 != uVar18);
  }
  puVar23 = (ulong *)(srcSize + (long)src);
  if (puVar22 < local_98) {
    local_88 = (ulong *)((long)puVar23 + -7);
    local_78 = (ulong *)((long)puVar23 + -3);
    local_80 = (ulong *)((long)puVar23 + -1);
    local_50 = puVar23 + -4;
    local_38 = ~(-1L << (bVar7 & 0x3f));
    local_b0 = puVar23;
    uVar21 = local_b8;
    do {
      pZVar6 = local_c8;
      local_90 = (ulong *)((long)puVar22 + 1);
      uVar8 = (uint)uVar25;
      local_58 = -uVar25;
      if (uVar8 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (*(int *)((long)local_90 - uVar25) == *(int *)((long)puVar22 + 1)) {
          puVar28 = (ulong *)((long)puVar22 + 5);
          puVar9 = (ulong *)((long)puVar22 + local_58 + 5);
          puVar11 = puVar28;
          if (puVar28 < local_88) {
            if (*puVar9 == *puVar28) {
              lVar13 = 0;
              do {
                puVar11 = (ulong *)((long)puVar22 + lVar13 + 0xd);
                if (local_88 <= puVar11) {
                  puVar9 = (ulong *)((long)puVar22 + local_58 + lVar13 + 0xd);
                  puVar11 = (ulong *)((long)puVar22 + lVar13 + 0xd);
                  goto LAB_001dbcbc;
                }
                uVar18 = *(ulong *)((long)puVar22 + lVar13 + local_58 + 0xd);
                uVar20 = *puVar11;
                lVar13 = lVar13 + 8;
              } while (uVar18 == uVar20);
              uVar20 = uVar20 ^ uVar18;
              uVar18 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar13;
            }
            else {
              uVar20 = *puVar28 ^ *puVar9;
              uVar18 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = uVar18 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001dbcbc:
            if ((puVar11 < local_78) && ((int)*puVar9 == (int)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar11 < local_80) && ((short)*puVar9 == (short)*puVar11)) {
              puVar11 = (ulong *)((long)puVar11 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar11 < puVar23) {
              puVar11 = (ulong *)((long)puVar11 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar11));
            }
            uVar18 = (long)puVar11 - (long)puVar28;
          }
          uVar18 = uVar18 + 4;
        }
      }
      local_d8 = 999999999;
      local_d0 = uVar16;
      if (uVar21 == 6) {
        if (local_cc == 6) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_6_6
                             (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
        }
        else if (local_cc == 5) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_6_5
                             (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
        }
        else {
          uVar20 = ZSTD_RowFindBestMatch_noDict_6_4
                             (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
        }
      }
      else if (uVar21 == 5) {
        if (local_cc == 6) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_5_6
                             (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
        }
        else if (local_cc == 5) {
          uVar20 = ZSTD_RowFindBestMatch_noDict_5_5
                             (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
        }
        else {
          uVar20 = ZSTD_RowFindBestMatch_noDict_5_4
                             (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
        }
      }
      else if (local_cc == 6) {
        uVar20 = ZSTD_RowFindBestMatch_noDict_4_6
                           (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
      }
      else if (local_cc == 5) {
        uVar20 = ZSTD_RowFindBestMatch_noDict_4_5
                           (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
      }
      else {
        uVar20 = ZSTD_RowFindBestMatch_noDict_4_4
                           (local_c8,(BYTE *)puVar22,(BYTE *)puVar23,&local_d8);
      }
      uVar24 = uVar18;
      if (uVar18 < uVar20) {
        uVar24 = uVar20;
      }
      if (uVar24 < 4) {
        pZVar6->lazySkipping = (uint)(0x7ff < (ulong)((long)puVar22 - (long)src));
        puVar23 = local_b0;
        puVar22 = (ulong *)((long)puVar22 + ((ulong)((long)puVar22 - (long)src) >> 8) + 1);
        uVar16 = local_d0;
      }
      else {
        puVar23 = puVar22;
        uVar25 = local_d8;
        if (uVar20 <= uVar18) {
          puVar23 = local_90;
          uVar25 = 1;
        }
        uVar18 = uVar24;
        local_bc = uVar8;
        if (puVar22 < local_98) {
          puVar28 = (ulong *)((long)puVar22 + 0xd);
          local_90 = puVar23;
          do {
            puVar11 = (ulong *)((long)puVar22 + 1);
            uVar18 = uVar24;
            if (uVar25 == 0) {
              uVar25 = 0;
            }
            else if ((local_bc != 0) && (*(int *)puVar11 == *(int *)((long)puVar11 + local_58))) {
              puVar23 = (ulong *)((long)puVar22 + local_58 + 5);
              puVar22 = (ulong *)((long)puVar22 + 5);
              puVar9 = puVar22;
              if (puVar22 < local_88) {
                if (*puVar23 == *puVar22) {
                  lVar13 = 0;
                  puVar9 = puVar28;
                  do {
                    if (local_88 <= puVar9) {
                      puVar23 = (ulong *)((long)puVar9 + local_58);
                      goto LAB_001dbec6;
                    }
                    puVar23 = (ulong *)((long)puVar9 + local_58);
                    uVar20 = *puVar9;
                    puVar9 = puVar9 + 1;
                    lVar13 = lVar13 + 8;
                  } while (*puVar23 == uVar20);
                  uVar20 = uVar20 ^ *puVar23;
                  uVar10 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  uVar20 = (uVar10 >> 3 & 0x1fffffff) + lVar13;
                }
                else {
                  uVar10 = *puVar22 ^ *puVar23;
                  uVar20 = 0;
                  if (uVar10 != 0) {
                    for (; (uVar10 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar20 = uVar20 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001dbec6:
                if ((puVar9 < local_78) && ((int)*puVar23 == (int)*puVar9)) {
                  puVar9 = (ulong *)((long)puVar9 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar9 < local_80) && ((short)*puVar23 == (short)*puVar9)) {
                  puVar9 = (ulong *)((long)puVar9 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar9 < local_b0) {
                  puVar9 = (ulong *)((long)puVar9 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar9));
                }
                uVar20 = (long)puVar9 - (long)puVar22;
              }
              uVar16 = (uint)uVar25;
              if (uVar16 == 0) goto LAB_001dc659;
              if (uVar20 < 0xfffffffffffffffc) {
                uVar21 = 0x1f;
                if (uVar16 != 0) {
                  for (; uVar16 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                  }
                }
                if ((int)((uVar21 ^ 0x1f) + (int)uVar24 * 3 + -0x1e) < (int)(uVar20 + 4) * 3) {
                  uVar25 = 1;
                  uVar18 = uVar20 + 4;
                  local_90 = puVar11;
                }
              }
            }
            local_d8 = 999999999;
            local_70 = puVar28;
            if (local_b8 == 6) {
              if (local_cc == 6) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_6_6
                                   (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
              }
              else if (local_cc == 5) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_6_5
                                   (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_noDict_6_4
                                   (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
              }
            }
            else if (local_b8 == 5) {
              if (local_cc == 6) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_5_6
                                   (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
              }
              else if (local_cc == 5) {
                uVar24 = ZSTD_RowFindBestMatch_noDict_5_5
                                   (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
              }
              else {
                uVar24 = ZSTD_RowFindBestMatch_noDict_5_4
                                   (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
              }
            }
            else if (local_cc == 6) {
              uVar24 = ZSTD_RowFindBestMatch_noDict_4_6
                                 (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
            }
            else if (local_cc == 5) {
              uVar24 = ZSTD_RowFindBestMatch_noDict_4_5
                                 (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
            }
            else {
              uVar24 = ZSTD_RowFindBestMatch_noDict_4_4
                                 (local_c8,(BYTE *)puVar11,(BYTE *)local_b0,&local_d8);
            }
            uVar16 = (uint)local_d8;
            if ((uVar16 == 0) || (uVar21 = (uint)uVar25, uVar21 == 0)) {
LAB_001dc659:
              __assert_fail("val != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                            ,0xab,"unsigned int ZSTD_highbit32(U32)");
            }
            puVar23 = local_90;
            if (uVar24 < 4) break;
            iVar15 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> iVar15 == 0; iVar15 = iVar15 + -1) {
              }
            }
            uVar16 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar16 == 0; uVar16 = uVar16 - 1) {
              }
            }
            if (((int)uVar24 * 4 - iVar15 <= (int)((uVar16 ^ 0x1f) + (int)uVar18 * 4 + -0x1b)) ||
               (puVar28 = (ulong *)((long)local_70 + 1), uVar25 = local_d8, puVar22 = puVar11,
               puVar23 = puVar11, uVar18 = uVar24, local_90 = puVar11, local_98 <= puVar11)) break;
          } while( true );
        }
        pZVar6 = local_c8;
        if (3 < uVar25) {
          if ((src < puVar23) && (local_40 < (BYTE *)((long)puVar23 + (3 - uVar25)))) {
            puVar22 = puVar23;
            while (puVar23 = puVar22,
                  *(BYTE *)((long)puVar22 + -1) == *(BYTE *)((long)puVar22 + (2 - uVar25))) {
              puVar23 = (ulong *)((long)puVar22 + -1);
              uVar18 = uVar18 + 1;
              if ((puVar23 <= src) ||
                 (pBVar26 = (BYTE *)((long)puVar22 + (2 - uVar25)), puVar22 = puVar23,
                 pBVar26 <= local_40)) break;
            }
          }
          local_d0 = local_bc;
          local_bc = (U32)uVar25 - 3;
        }
        if (local_a8->maxNbSeq <=
            (ulong)((long)local_a8->sequences - (long)local_a8->sequencesStart >> 3)) {
LAB_001dc6f4:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_a8->maxNbLit) {
LAB_001dc713:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)puVar23 - (long)src;
        puVar22 = (ulong *)local_a8->lit;
        if (local_a8->litStart + local_a8->maxNbLit < (BYTE *)((long)puVar22 + uVar20)) {
LAB_001dc6b6:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_b0 < puVar23) {
LAB_001dc6d5:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar23) {
          ZSTD_safecopyLiterals((BYTE *)puVar22,(BYTE *)src,(BYTE *)puVar23,(BYTE *)local_50);
LAB_001dc19f:
          local_a8->lit = local_a8->lit + uVar20;
          if (0xffff < uVar20) {
            if (local_a8->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_a8->longLengthType = ZSTD_llt_literalLength;
            local_a8->longLengthPos =
                 (U32)((ulong)((long)local_a8->sequences - (long)local_a8->sequencesStart) >> 3);
          }
        }
        else {
          uVar24 = *(ulong *)((long)src + 8);
          *puVar22 = *src;
          puVar22[1] = uVar24;
          pBVar26 = local_a8->lit;
          if (0x10 < uVar20) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar26 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar24 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar26 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar26 + 0x18) = uVar24;
            if (0x20 < (long)uVar20) {
              lVar13 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar13 + 0x20);
                uVar5 = puVar2[1];
                pBVar1 = pBVar26 + lVar13 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar5;
                puVar2 = (undefined8 *)((long)src + lVar13 + 0x30);
                uVar5 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar5;
                lVar13 = lVar13 + 0x20;
              } while (pBVar1 + 0x20 < pBVar26 + uVar20);
            }
            goto LAB_001dc19f;
          }
          local_a8->lit = pBVar26 + uVar20;
        }
        uVar21 = local_b8;
        psVar17 = local_a8->sequences;
        psVar17->litLength = (U16)uVar20;
        psVar17->offBase = (U32)uVar25;
        if (uVar18 < 3) {
LAB_001dc732:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar18 - 3) {
          if (local_a8->longLengthType != ZSTD_llt_none) {
LAB_001dc751:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_a8->longLengthType = ZSTD_llt_matchLength;
          local_a8->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)local_a8->sequencesStart) >> 3);
        }
        psVar17->mlBase = (U16)(uVar18 - 3);
        psVar17 = psVar17 + 1;
        local_a8->sequences = psVar17;
        if (pZVar6->lazySkipping != 0) {
          uVar16 = pZVar6->nextToUpdate;
          uVar25 = (ulong)uVar16;
          uVar8 = ((int)local_98 - (int)(local_a0 + uVar25)) + 1;
          if (7 < uVar8) {
            uVar8 = 8;
          }
          if (local_98 < local_a0 + uVar25) {
            uVar8 = 0;
          }
          if (uVar16 < uVar8 + uVar16) {
            if (0x20 < pZVar6->rowHashLog + 8) goto LAB_001dc770;
            pUVar3 = pZVar6->hashTable;
            pBVar26 = pZVar6->tagTable;
            uVar20 = pZVar6->hashSalt;
            cVar4 = (char)pZVar6->rowHashLog;
            do {
              if (local_b8 == 5) {
                uVar24 = *(long *)(local_a0 + uVar25) * -0x30e4432345000000;
LAB_001dc359:
                uVar14 = (uint)((uVar24 ^ uVar20) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (local_b8 == 6) {
                  uVar24 = *(long *)(local_a0 + uVar25) * -0x30e4432340650000;
                  goto LAB_001dc359;
                }
                uVar14 = (*(int *)(local_a0 + uVar25) * -0x61c8864f ^ (uint)uVar20) >>
                         (0x18U - cVar4 & 0x1f);
              }
              uVar27 = (uVar14 >> 8) << ((byte)local_cc & 0x1f);
              if (((ulong)(pUVar3 + uVar27) & 0x3f) != 0) goto LAB_001dc697;
              if ((local_38 & (ulong)(pBVar26 + uVar27)) != 0) goto LAB_001dc678;
              pZVar6->hashCache[(uint)uVar25 & 7] = uVar14;
              uVar25 = uVar25 + 1;
            } while (uVar8 + uVar16 != uVar25);
          }
          pZVar6->lazySkipping = 0;
        }
        src = (void *)((long)puVar23 + uVar18);
        puVar23 = local_b0;
        if ((local_d0 == 0) || (local_98 < src)) {
          uVar25 = (ulong)local_bc;
          puVar22 = (ulong *)src;
          uVar16 = local_d0;
        }
        else {
          uVar25 = (ulong)local_bc;
          uVar18 = (ulong)local_d0;
          while( true ) {
            uVar20 = uVar25;
            uVar8 = (uint)uVar20;
            uVar25 = uVar20;
            puVar22 = (ulong *)src;
            uVar16 = (uint)uVar18;
            if ((int)*src != *(int *)((long)src - uVar18)) break;
            lVar13 = -uVar18;
            puVar22 = (ulong *)((long)src + 4);
            puVar11 = (ulong *)((long)src + lVar13 + 4);
            puVar28 = puVar22;
            if (puVar22 < local_88) {
              if (*puVar11 == *puVar22) {
                lVar19 = 0;
                do {
                  puVar28 = (ulong *)((long)src + lVar19 + 0xc);
                  if (local_88 <= puVar28) {
                    puVar11 = (ulong *)((long)src + lVar13 + lVar19 + 0xc);
                    puVar28 = (ulong *)((long)src + lVar19 + 0xc);
                    goto LAB_001dc4ae;
                  }
                  uVar25 = *(ulong *)((long)src + lVar19 + lVar13 + 0xc);
                  uVar24 = *puVar28;
                  lVar19 = lVar19 + 8;
                } while (uVar25 == uVar24);
                uVar24 = uVar24 ^ uVar25;
                uVar25 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar19;
              }
              else {
                uVar24 = *puVar22 ^ *puVar11;
                uVar25 = 0;
                if (uVar24 != 0) {
                  for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                uVar25 = uVar25 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001dc4ae:
              if ((puVar28 < local_78) && ((int)*puVar11 == (int)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 4);
                puVar11 = (ulong *)((long)puVar11 + 4);
              }
              if ((puVar28 < local_80) && ((short)*puVar11 == (short)*puVar28)) {
                puVar28 = (ulong *)((long)puVar28 + 2);
                puVar11 = (ulong *)((long)puVar11 + 2);
              }
              if (puVar28 < puVar23) {
                puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar11 == (BYTE)*puVar28));
              }
              uVar25 = (long)puVar28 - (long)puVar22;
            }
            if (local_a8->maxNbSeq <= (ulong)((long)psVar17 - (long)local_a8->sequencesStart >> 3))
            goto LAB_001dc6f4;
            if (0x20000 < local_a8->maxNbLit) goto LAB_001dc713;
            puVar22 = (ulong *)local_a8->lit;
            if (local_a8->litStart + local_a8->maxNbLit < puVar22) goto LAB_001dc6b6;
            if (puVar23 < src) goto LAB_001dc6d5;
            if (local_50 < src) {
              ZSTD_safecopyLiterals((BYTE *)puVar22,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
              puVar23 = local_b0;
            }
            else {
              uVar24 = *(ulong *)((long)src + 8);
              *puVar22 = *src;
              puVar22[1] = uVar24;
            }
            psVar17 = local_a8->sequences;
            psVar17->litLength = 0;
            psVar17->offBase = 1;
            if (uVar25 + 4 < 3) goto LAB_001dc732;
            if (0xffff < uVar25 + 1) {
              if (local_a8->longLengthType != ZSTD_llt_none) goto LAB_001dc751;
              local_a8->longLengthType = ZSTD_llt_matchLength;
              local_a8->longLengthPos =
                   (U32)((ulong)((long)psVar17 - (long)local_a8->sequencesStart) >> 3);
            }
            psVar17->mlBase = (U16)(uVar25 + 1);
            psVar17 = psVar17 + 1;
            local_a8->sequences = psVar17;
            src = (void *)((long)src + uVar25 + 4);
            uVar25 = uVar18;
            puVar22 = (ulong *)src;
            uVar16 = uVar8;
            if ((uVar8 == 0) || (uVar18 = uVar20, local_98 < src)) break;
          }
        }
      }
      uVar8 = (uint)uVar25;
      local_d0 = uVar16;
    } while (puVar22 < local_98);
  }
  if (local_64 <= local_5c) {
    local_64 = 0;
  }
  uVar16 = local_64;
  if (uVar8 != 0) {
    uVar16 = local_60;
  }
  if (local_60 <= local_5c) {
    uVar16 = local_64;
    local_60 = 0;
  }
  if (uVar8 != 0) {
    local_60 = uVar8;
  }
  if (local_d0 != 0) {
    uVar16 = local_d0;
  }
  *local_48 = local_60;
  local_48[1] = uVar16;
  return (long)puVar23 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}